

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fGeometryShaderTests.cpp
# Opt level: O3

IterateResult __thiscall
deqp::gles31::Functional::anon_unknown_1::GeometryShaderRenderTest::iterate
          (GeometryShaderRenderTest *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  TestLog *pTVar3;
  int iVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  int iVar8;
  undefined4 uVar9;
  RenderTarget *pRVar10;
  undefined4 extraout_var;
  NotSupportedError *this_00;
  long *plVar11;
  Surface *pSVar12;
  size_type *psVar13;
  void *__buf;
  void *__buf_00;
  void *__buf_01;
  void *__buf_02;
  int iVar14;
  void *pvVar15;
  int dy;
  int dx;
  int iVar16;
  int iVar17;
  int iVar18;
  int iVar19;
  uint uVar20;
  uint uVar21;
  uint uVar22;
  RGBA testColor;
  Surface errorMask;
  RGBA refcolor;
  size_type __dnew;
  string local_438;
  string local_418;
  int local_3f8;
  int local_3f4;
  LogImageSet local_3f0;
  Surface local_3b0;
  string local_398;
  string local_378;
  LogImage local_358;
  string local_2c8;
  string local_2a8;
  string local_288;
  string local_268;
  LogImage local_248;
  undefined1 local_1b8 [8];
  int iStack_1b0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1a8;
  _Alloc_hider local_198;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_188 [4];
  ios_base local_140 [272];
  
  iVar8 = this->m_interationCount;
  this->m_interationCount = iVar8 + 1;
  if (iVar8 == 1) {
    iVar8 = (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[5])(this);
    renderWithContext(this,this->m_glContext,(ShaderProgram *)CONCAT44(extraout_var,iVar8),
                      this->m_glResult);
    renderWithContext(this,&this->m_refContext->super_Context,
                      (ShaderProgram *)CONCAT44(extraout_var,iVar8),this->m_refResult);
  }
  else {
    if (iVar8 != 0) {
      pRVar10 = Context::getRenderTarget((this->super_TestCase).m_context);
      if (pRVar10->m_numSamples < 2) {
        tcu::Surface::Surface
                  (&local_3b0,(this->m_viewportSize).m_data[0],(this->m_viewportSize).m_data[1]);
        iVar8 = (this->m_viewportSize).m_data[0];
        if (0 < iVar8) {
          iVar16 = (this->m_viewportSize).m_data[1];
          bVar7 = true;
          iVar4 = 0;
          do {
            if (iVar16 < 1) {
              iVar14 = iVar4 + 1;
            }
            else {
              iVar14 = iVar4 + 1;
              iVar8 = 0;
              local_3f8 = iVar14;
              do {
                if (((iVar4 == 0 || iVar8 == 0) || (iVar14 == (this->m_viewportSize).m_data[0])) ||
                   (iVar8 + 1 == iVar16)) {
                  *(undefined4 *)
                   ((long)local_3b0.m_pixels.m_ptr + (long)(iVar8 * local_3b0.m_width + iVar4) * 4)
                       = 0xff00ff00;
                  iVar8 = iVar8 + 1;
                }
                else {
                  local_248.m_name._M_dataplus._M_p._0_4_ =
                       *(undefined4 *)
                        ((long)(this->m_refResult->m_pixels).m_ptr +
                        (long)(this->m_refResult->m_width * iVar8 + iVar4) * 4);
                  iVar16 = -1;
                  bVar6 = false;
                  local_3f4 = iVar8 + 1;
                  do {
                    iVar14 = -1;
                    do {
                      bVar5 = bVar6;
                      local_3f0.m_name._M_dataplus._M_p._0_4_ =
                           *(undefined4 *)
                            ((long)(this->m_glResult->m_pixels).m_ptr +
                            (long)((iVar14 + iVar8) * this->m_glResult->m_width + iVar16 + iVar4) *
                            4);
                      tcu::RGBA::toIVec((RGBA *)local_1b8);
                      tcu::RGBA::toIVec((RGBA *)&local_358);
                      uVar20 = local_1b8._0_4_ - (int)local_358.m_name._M_dataplus._M_p >> 0x1f;
                      uVar21 = local_1b8._4_4_ - local_358.m_name._M_dataplus._M_p._4_4_ >> 0x1f;
                      uVar22 = iStack_1b0 - (int)local_358.m_name._M_string_length >> 0x1f;
                      iVar17 = (local_1b8._0_4_ - (int)local_358.m_name._M_dataplus._M_p ^ uVar20) -
                               uVar20;
                      iVar18 = (local_1b8._4_4_ - local_358.m_name._M_dataplus._M_p._4_4_ ^ uVar21)
                               - uVar21;
                      iVar19 = (iStack_1b0 - (int)local_358.m_name._M_string_length ^ uVar22) -
                               uVar22;
                      if (iVar18 < iVar17) {
                        iVar18 = iVar17;
                      }
                      if (iVar18 <= iVar19) {
                        iVar18 = iVar19;
                      }
                      bVar6 = (bool)(bVar5 | iVar18 < 0x15);
                      iVar14 = iVar14 + 1;
                    } while (iVar14 != 2);
                    iVar16 = iVar16 + 1;
                  } while (iVar16 != 2);
                  bVar7 = (bool)(bVar7 & bVar6);
                  uVar9 = 0xff0000ff;
                  if (bVar5 || iVar18 < 0x15) {
                    uVar9 = 0xff00ff00;
                  }
                  *(undefined4 *)
                   ((long)local_3b0.m_pixels.m_ptr + (long)(iVar8 * local_3b0.m_width + iVar4) * 4)
                       = uVar9;
                  iVar14 = local_3f8;
                  iVar8 = local_3f4;
                }
                iVar16 = (this->m_viewportSize).m_data[1];
              } while (iVar8 < iVar16);
              iVar8 = (this->m_viewportSize).m_data[0];
            }
            iVar4 = iVar14;
          } while (iVar14 < iVar8);
          if (!bVar7) {
            pTVar3 = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
            local_418.field_2._M_allocated_capacity._0_4_ = 0x706d6f43;
            local_418.field_2._M_allocated_capacity._4_2_ = 0x7261;
            local_418.field_2._M_local_buf[6] = 'e';
            local_418.field_2._M_local_buf[7] = ' ';
            local_418.field_2._8_6_ = 0x746c75736572;
            local_418._M_string_length = 0xe;
            local_418.field_2._M_local_buf[0xe] = '\0';
            local_438._M_dataplus._M_p = (pointer)&local_438.field_2;
            local_1b8._0_4_ = S;
            local_1b8._4_4_ = SNORM_INT8;
            local_418._M_dataplus._M_p = (pointer)&local_418.field_2;
            local_438._M_dataplus._M_p =
                 (pointer)std::__cxx11::string::_M_create((ulong *)&local_438,(ulong)local_1b8);
            local_438.field_2._M_allocated_capacity = (size_type)local_1b8;
            *(undefined8 *)local_438._M_dataplus._M_p = 0x6f20746c75736552;
            *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_438._M_dataplus._M_p + 8) = 'f';
            *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_438._M_dataplus._M_p + 9) = ' ';
            *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_438._M_dataplus._M_p + 10) = 'r';
            *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_438._M_dataplus._M_p + 0xb) = 'e';
            *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_438._M_dataplus._M_p + 0xc) = 'n';
            *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_438._M_dataplus._M_p + 0xd) = 'd';
            *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_438._M_dataplus._M_p + 0xe) = 'e';
            *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_438._M_dataplus._M_p + 0xf) = 'r';
            *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_438._M_dataplus._M_p + 0xf) = 'r';
            *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_438._M_dataplus._M_p + 0x10) = 'i';
            *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_438._M_dataplus._M_p + 0x11) = 'n';
            *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_438._M_dataplus._M_p + 0x12) = 'g';
            local_438._M_string_length = (size_type)local_1b8;
            local_438._M_dataplus._M_p[(long)local_1b8] = '\0';
            tcu::LogImageSet::LogImageSet(&local_3f0,&local_418,&local_438);
            tcu::TestLog::startImageSet
                      (pTVar3,local_3f0.m_name._M_dataplus._M_p,
                       local_3f0.m_description._M_dataplus._M_p);
            local_378._M_dataplus._M_p = (pointer)&local_378.field_2;
            local_378.field_2._M_allocated_capacity._0_4_ = 0x75736552;
            local_378.field_2._M_allocated_capacity._4_2_ = 0x746c;
            local_378._M_string_length = 6;
            local_378.field_2._M_local_buf[6] = '\0';
            local_398._M_dataplus._M_p = (pointer)&local_398.field_2;
            local_398.field_2._M_allocated_capacity._0_4_ = 0x75736552;
            local_398.field_2._M_allocated_capacity._4_2_ = 0x746c;
            local_398._M_string_length = 6;
            local_398.field_2._M_local_buf[6] = '\0';
            pSVar12 = this->m_glResult;
            tcu::LogImage::LogImage
                      ((LogImage *)local_1b8,&local_378,&local_398,pSVar12,
                       QP_IMAGE_COMPRESSION_MODE_BEST);
            iVar8 = (int)pTVar3;
            tcu::LogImage::write((LogImage *)local_1b8,iVar8,__buf_00,(size_t)pSVar12);
            local_268.field_2._M_allocated_capacity = 0x636e657265666552;
            local_268.field_2._8_2_ = 0x65;
            local_268._M_string_length = 9;
            local_288.field_2._M_allocated_capacity = 0x636e657265666552;
            local_288.field_2._8_2_ = 0x65;
            local_288._M_string_length = 9;
            pSVar12 = this->m_refResult;
            local_288._M_dataplus._M_p = (pointer)&local_288.field_2;
            local_268._M_dataplus._M_p = (pointer)&local_268.field_2;
            tcu::LogImage::LogImage
                      (&local_358,&local_268,&local_288,pSVar12,QP_IMAGE_COMPRESSION_MODE_BEST);
            tcu::LogImage::write(&local_358,iVar8,__buf_01,(size_t)pSVar12);
            local_2a8.field_2._M_allocated_capacity = 0x73614d726f727245;
            local_2a8.field_2._8_2_ = 0x6b;
            local_2a8._M_string_length = 9;
            local_2c8.field_2._M_allocated_capacity = 0x616d20726f727245;
            local_2c8.field_2._8_2_ = 0x6b73;
            local_2c8._M_string_length = 10;
            local_2c8.field_2._M_local_buf[10] = '\0';
            pSVar12 = &local_3b0;
            local_2c8._M_dataplus._M_p = (pointer)&local_2c8.field_2;
            local_2a8._M_dataplus._M_p = (pointer)&local_2a8.field_2;
            tcu::LogImage::LogImage
                      (&local_248,&local_2a8,&local_2c8,pSVar12,QP_IMAGE_COMPRESSION_MODE_BEST);
            tcu::LogImage::write(&local_248,iVar8,__buf_02,(size_t)pSVar12);
            tcu::TestLog::endImageSet(pTVar3);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_248.m_description._M_dataplus._M_p != &local_248.m_description.field_2) {
              operator_delete(local_248.m_description._M_dataplus._M_p,
                              local_248.m_description.field_2._M_allocated_capacity + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_248.m_name._M_dataplus._M_p != &local_248.m_name.field_2) {
              operator_delete(local_248.m_name._M_dataplus._M_p,
                              CONCAT26(local_248.m_name.field_2._M_allocated_capacity._6_2_,
                                       local_248.m_name.field_2._M_allocated_capacity._0_6_) + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_2c8._M_dataplus._M_p != &local_2c8.field_2) {
              operator_delete(local_2c8._M_dataplus._M_p,local_2c8.field_2._M_allocated_capacity + 1
                             );
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_2a8._M_dataplus._M_p != &local_2a8.field_2) {
              operator_delete(local_2a8._M_dataplus._M_p,local_2a8.field_2._M_allocated_capacity + 1
                             );
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_358.m_description._M_dataplus._M_p != &local_358.m_description.field_2) {
              operator_delete(local_358.m_description._M_dataplus._M_p,
                              local_358.m_description.field_2._M_allocated_capacity + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_358.m_name._M_dataplus._M_p != &local_358.m_name.field_2) {
              operator_delete(local_358.m_name._M_dataplus._M_p,
                              local_358.m_name.field_2._M_allocated_capacity + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_288._M_dataplus._M_p != &local_288.field_2) {
              operator_delete(local_288._M_dataplus._M_p,local_288.field_2._M_allocated_capacity + 1
                             );
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_268._M_dataplus._M_p != &local_268.field_2) {
              operator_delete(local_268._M_dataplus._M_p,local_268.field_2._M_allocated_capacity + 1
                             );
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_198._M_p != local_188) {
              operator_delete(local_198._M_p,local_188[0]._M_allocated_capacity + 1);
            }
            if (local_1b8 != (undefined1  [8])&local_1a8) {
              operator_delete((void *)local_1b8,local_1a8._M_allocated_capacity + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_398._M_dataplus._M_p != &local_398.field_2) {
              operator_delete(local_398._M_dataplus._M_p,
                              CONCAT17(local_398.field_2._M_local_buf[7],
                                       CONCAT16(local_398.field_2._M_local_buf[6],
                                                CONCAT24(local_398.field_2._M_allocated_capacity.
                                                         _4_2_,local_398.field_2.
                                                               _M_allocated_capacity._0_4_))) + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_378._M_dataplus._M_p != &local_378.field_2) {
              operator_delete(local_378._M_dataplus._M_p,
                              CONCAT17(local_378.field_2._M_local_buf[7],
                                       CONCAT16(local_378.field_2._M_local_buf[6],
                                                CONCAT24(local_378.field_2._M_allocated_capacity.
                                                         _4_2_,local_378.field_2.
                                                               _M_allocated_capacity._0_4_))) + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_3f0.m_description._M_dataplus._M_p != &local_3f0.m_description.field_2) {
              operator_delete(local_3f0.m_description._M_dataplus._M_p,
                              local_3f0.m_description.field_2._M_allocated_capacity + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_3f0.m_name._M_dataplus._M_p != &local_3f0.m_name.field_2) {
              operator_delete(local_3f0.m_name._M_dataplus._M_p,
                              local_3f0.m_name.field_2._M_allocated_capacity + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_438._M_dataplus._M_p != &local_438.field_2) {
              operator_delete(local_438._M_dataplus._M_p,local_438.field_2._M_allocated_capacity + 1
                             );
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_418._M_dataplus._M_p != &local_418.field_2) {
              operator_delete(local_418._M_dataplus._M_p,
                              CONCAT17(local_418.field_2._M_local_buf[7],
                                       CONCAT16(local_418.field_2._M_local_buf[6],
                                                CONCAT24(local_418.field_2._M_allocated_capacity.
                                                         _4_2_,local_418.field_2.
                                                               _M_allocated_capacity._0_4_))) + 1);
            }
            local_1b8 = (undefined1  [8])
                        ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
            std::__cxx11::ostringstream::ostringstream((ostringstream *)&iStack_1b0);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&iStack_1b0,"Image compare failed.",0x15);
            tcu::MessageBuilder::operator<<
                      ((MessageBuilder *)local_1b8,(EndMessageToken *)&tcu::TestLog::EndMessage);
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)&iStack_1b0);
            std::ios_base::~ios_base(local_140);
            tcu::Surface::~Surface(&local_3b0);
            goto LAB_013d48ca;
          }
        }
        pTVar3 = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
        paVar2 = &local_248.m_name.field_2;
        local_248.m_name.field_2._M_allocated_capacity._0_6_ = 0x7261706d6f43;
        local_248.m_name.field_2._M_allocated_capacity._6_2_ = 0x2065;
        local_248.m_name.field_2._8_6_ = 0x746c75736572;
        local_248.m_name._M_string_length = 0xe;
        local_248.m_name.field_2._M_local_buf[0xe] = '\0';
        paVar1 = &local_3f0.m_name.field_2;
        local_1b8._0_4_ = S;
        local_1b8._4_4_ = SNORM_INT8;
        local_3f0.m_name._M_dataplus._M_p = (pointer)paVar1;
        local_248.m_name._M_dataplus._M_p = (pointer)paVar2;
        local_3f0.m_name._M_dataplus._M_p =
             (pointer)std::__cxx11::string::_M_create((ulong *)&local_3f0,(ulong)local_1b8);
        local_3f0.m_name.field_2._M_allocated_capacity = (size_type)local_1b8;
        builtin_strncpy(local_3f0.m_name._M_dataplus._M_p,"Result of rendering",0x13);
        local_3f0.m_name._M_string_length = (size_type)local_1b8;
        local_3f0.m_name._M_dataplus._M_p[(long)local_1b8] = '\0';
        tcu::LogImageSet::LogImageSet((LogImageSet *)&local_358,&local_248.m_name,&local_3f0.m_name)
        ;
        tcu::TestLog::startImageSet
                  (pTVar3,local_358.m_name._M_dataplus._M_p,local_358.m_description._M_dataplus._M_p
                  );
        local_418.field_2._M_allocated_capacity._0_4_ = 0x75736552;
        local_418.field_2._M_allocated_capacity._4_2_ = 0x746c;
        local_418._M_string_length = 6;
        local_418.field_2._M_local_buf[6] = '\0';
        local_438._M_string_length._0_4_ = RA;
        local_438._M_string_length._4_4_ = SNORM_INT8;
        local_438.field_2._M_allocated_capacity._0_7_ = 0x746c75736552;
        pSVar12 = this->m_glResult;
        local_438._M_dataplus._M_p = (pointer)&local_438.field_2;
        local_418._M_dataplus._M_p = (pointer)&local_418.field_2;
        tcu::LogImage::LogImage
                  ((LogImage *)local_1b8,&local_418,&local_438,pSVar12,
                   QP_IMAGE_COMPRESSION_MODE_BEST);
        tcu::LogImage::write((LogImage *)local_1b8,(int)pTVar3,__buf,(size_t)pSVar12);
        tcu::TestLog::endImageSet(pTVar3);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_198._M_p != local_188) {
          operator_delete(local_198._M_p,local_188[0]._M_allocated_capacity + 1);
        }
        if (local_1b8 != (undefined1  [8])&local_1a8) {
          operator_delete((void *)local_1b8,local_1a8._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_438._M_dataplus._M_p != &local_438.field_2) {
          operator_delete(local_438._M_dataplus._M_p,local_438.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_418._M_dataplus._M_p != &local_418.field_2) {
          operator_delete(local_418._M_dataplus._M_p,
                          CONCAT17(local_418.field_2._M_local_buf[7],
                                   CONCAT16(local_418.field_2._M_local_buf[6],
                                            CONCAT24(local_418.field_2._M_allocated_capacity._4_2_,
                                                     local_418.field_2._M_allocated_capacity._0_4_))
                                  ) + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_358.m_description._M_dataplus._M_p != &local_358.m_description.field_2) {
          operator_delete(local_358.m_description._M_dataplus._M_p,
                          local_358.m_description.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_358.m_name._M_dataplus._M_p != &local_358.m_name.field_2) {
          operator_delete(local_358.m_name._M_dataplus._M_p,
                          local_358.m_name.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_3f0.m_name._M_dataplus._M_p != paVar1) {
          operator_delete(local_3f0.m_name._M_dataplus._M_p,
                          local_3f0.m_name.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_248.m_name._M_dataplus._M_p != paVar2) {
          operator_delete(local_248.m_name._M_dataplus._M_p,
                          CONCAT26(local_248.m_name.field_2._M_allocated_capacity._6_2_,
                                   local_248.m_name.field_2._M_allocated_capacity._0_6_) + 1);
        }
        local_1b8 = (undefined1  [8])
                    ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&iStack_1b0);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&iStack_1b0,"Image compare ok.",0x11);
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)local_1b8,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&iStack_1b0);
        std::ios_base::~ios_base(local_140);
        tcu::Surface::~Surface(&local_3b0);
      }
      else {
        pTVar3 = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
        pSVar12 = this->m_refResult;
        local_358.m_name._M_dataplus._M_p = (char *)0x300000008;
        pvVar15 = (void *)(pSVar12->m_pixels).m_cap;
        if (pvVar15 != (void *)0x0) {
          pvVar15 = (pSVar12->m_pixels).m_ptr;
        }
        tcu::PixelBufferAccess::PixelBufferAccess
                  ((PixelBufferAccess *)local_1b8,(TextureFormat *)&local_358,pSVar12->m_width,
                   pSVar12->m_height,1,pvVar15);
        pSVar12 = this->m_glResult;
        local_248.m_name._M_dataplus._M_p = (pointer)0x300000008;
        pvVar15 = (void *)(pSVar12->m_pixels).m_cap;
        if (pvVar15 != (void *)0x0) {
          pvVar15 = (pSVar12->m_pixels).m_ptr;
        }
        tcu::PixelBufferAccess::PixelBufferAccess
                  ((PixelBufferAccess *)&local_358,(TextureFormat *)&local_248,pSVar12->m_width,
                   pSVar12->m_height,1,pvVar15);
        bVar7 = tcu::fuzzyCompare(pTVar3,"Compare Results","Compare Results",
                                  (ConstPixelBufferAccess *)local_1b8,
                                  (ConstPixelBufferAccess *)&local_358,0.02,COMPARE_LOG_RESULT);
        if (!bVar7) {
LAB_013d48ca:
          tcu::TestContext::setTestResult
                    ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,
                     QP_TEST_RESULT_FAIL,"Image comparison failed");
          return STOP;
        }
      }
      tcu::TestContext::setTestResult
                ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,QP_TEST_RESULT_PASS,
                 "Pass");
      return STOP;
    }
    pRVar10 = Context::getRenderTarget((this->super_TestCase).m_context);
    iVar8 = pRVar10->m_width;
    pRVar10 = Context::getRenderTarget((this->super_TestCase).m_context);
    if ((iVar8 < (this->m_viewportSize).m_data[0]) ||
       (pRVar10->m_height < (this->m_viewportSize).m_data[1])) {
      this_00 = (NotSupportedError *)__cxa_allocate_exception(0x38);
      local_3f0.m_name._M_dataplus._M_p = (pointer)&local_3f0.m_name.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_3f0,"Render target size must be at least ","");
      de::toString<int>(&local_418,(this->m_viewportSize).m_data);
      std::operator+(&local_248.m_name,&local_3f0.m_name,&local_418);
      plVar11 = (long *)std::__cxx11::string::append((char *)&local_248);
      local_358.m_name._M_dataplus._M_p = (pointer)*plVar11;
      psVar13 = (size_type *)(plVar11 + 2);
      if ((size_type *)local_358.m_name._M_dataplus._M_p == psVar13) {
        local_358.m_name.field_2._M_allocated_capacity = *psVar13;
        local_358.m_name.field_2._8_8_ = plVar11[3];
        local_358.m_name._M_dataplus._M_p = (pointer)&local_358.m_name.field_2;
      }
      else {
        local_358.m_name.field_2._M_allocated_capacity = *psVar13;
      }
      local_358.m_name._M_string_length = plVar11[1];
      *plVar11 = (long)psVar13;
      plVar11[1] = 0;
      *(undefined1 *)(plVar11 + 2) = 0;
      de::toString<int>(&local_438,(this->m_viewportSize).m_data + 1);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1b8,
                     &local_358.m_name,&local_438);
      tcu::NotSupportedError::NotSupportedError(this_00,(string *)local_1b8);
      __cxa_throw(this_00,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
    }
    (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[6])(this);
  }
  return CONTINUE;
}

Assistant:

tcu::TestCase::IterateResult GeometryShaderRenderTest::iterate (void)
{
	// init() must be called
	DE_ASSERT(m_glContext);
	DE_ASSERT(m_refContext);

	const int iteration = m_interationCount++;

	if (iteration == 0)
	{
		// Check requirements
		const int width	 = m_context.getRenderTarget().getWidth();
		const int height = m_context.getRenderTarget().getHeight();

		if (width < m_viewportSize.x() || height < m_viewportSize.y())
			throw tcu::NotSupportedError(std::string("Render target size must be at least ") + de::toString(m_viewportSize.x()) + "x" + de::toString(m_viewportSize.y()));

		// Gen data
		genVertexAttribData();

		return CONTINUE;
	}
	else if (iteration == 1)
	{
		// Render
		sglr::ShaderProgram& program = getProgram();

		renderWithContext(*m_glContext, program, *m_glResult);
		renderWithContext(*m_refContext, program, *m_refResult);

		return CONTINUE;
	}
	else
	{
		if (compare())
			m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
		else
			m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Image comparison failed");

		return STOP;
	}
}